

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ways.cxx
# Opt level: O1

void __thiscall xray_re::xr_way_object::load(xr_way_object *this,xr_reader *r)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort *puVar2;
  size_t sVar3;
  ulong uVar4;
  uint16_t version;
  read_point_le local_6b;
  short local_6a;
  way_point_le local_68;
  
  sVar3 = xr_reader::r_raw_chunk(r,1,&local_6a,2);
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_ways.cxx"
                  ,0x1c,"virtual void xray_re::xr_way_object::load(xr_reader &)");
  }
  if (local_6a != 0x13) {
    __assert_fail("version == WAYOBJECT_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_ways.cxx"
                  ,0x1d,"virtual void xray_re::xr_way_object::load(xr_reader &)");
  }
  xr_custom_object::load(&this->super_xr_custom_object,r);
  sVar3 = xr_reader::find_chunk(r,2);
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_ways.cxx"
                  ,0x22,"virtual void xray_re::xr_way_object::load(xr_reader &)");
  }
  puVar2 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  uVar4 = (ulong)*puVar2;
  std::vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>::reserve
            (&this->m_points,uVar4);
  if (uVar4 != 0) {
    paVar1 = &local_68.super_way_point.name.field_2;
    do {
      local_68.super_way_point.name.field_2._8_8_ = 0;
      local_68.super_way_point.position.field_0._0_8_ = 0;
      local_68.super_way_point._40_8_ = 0;
      local_68.id = 0;
      local_68._50_6_ = 0;
      local_68.super_way_point.name._M_string_length = 0;
      local_68.super_way_point.name.field_2._M_allocated_capacity = 0;
      local_68.super_way_point.name._M_dataplus._M_p = (pointer)paVar1;
      std::vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>::
      emplace_back<xray_re::way_point_le>(&this->m_points,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.super_way_point.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_68.super_way_point.name._M_dataplus._M_p,
                        local_68.super_way_point.name.field_2._M_allocated_capacity + 1);
      }
      uVar4 = uVar4 - 1;
      read_point_le::operator()
                (&local_6b,
                 (this->m_points).
                 super__Vector_base<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1,r);
    } while (uVar4 != 0);
  }
  sVar3 = xr_reader::find_chunk(r,3);
  if (sVar3 != 0) {
    puVar2 = (r->field_2).m_p_u16;
    (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
    uVar4 = (ulong)*puVar2;
    std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>::reserve
              (&this->m_links,uVar4);
    if (uVar4 != 0) {
      do {
        local_68.super_way_point.name._M_dataplus._M_p = (pointer)0x0;
        std::vector<xray_re::way_link,_std::allocator<xray_re::way_link>_>::
        emplace_back<xray_re::way_link>(&this->m_links,(way_link *)&local_68);
        way_link_io::operator()
                  ((way_link_io *)&local_6b,
                   (this->m_links).
                   super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>._M_impl
                   .super__Vector_impl_data._M_finish + -1,r);
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    xr_reader::r_raw_chunk(r,4,&this->m_type,4);
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_ways.cxx"
                ,0x27,"virtual void xray_re::xr_way_object::load(xr_reader &)");
}

Assistant:

void xr_way_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(WAYOBJECT_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == WAYOBJECT_VERSION);

	xr_custom_object::load(r);

	if (!r.find_chunk(WAYOBJECT_CHUNK_POINTS))
		xr_not_expected();
	r.r_seq(r.r_u16(), m_points, read_point_le());
	r.debug_find_chunk();

	if (!r.find_chunk(WAYOBJECT_CHUNK_LINKS))
		xr_not_expected();
	r.r_seq(r.r_u16(), m_links, way_link_io());
	r.debug_find_chunk();

	r.r_chunk<uint32_t>(WAYOBJECT_CHUNK_TYPE, m_type);
}